

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<kj::OwnFd> * __thiscall
kj::_::ExceptionOr<kj::OwnFd>::operator=
          (ExceptionOr<kj::OwnFd> *this,ExceptionOr<kj::OwnFd> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<kj::OwnFd>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;